

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_sine.c
# Opt level: O3

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  unsigned_long uVar1;
  float *out;
  int iVar2;
  int iVar3;
  
  if (framesPerBuffer != 0) {
    iVar2 = *(int *)((long)userData + 800);
    iVar3 = *(int *)((long)userData + 0x324);
    uVar1 = 0;
    do {
      *(undefined4 *)((long)outputBuffer + uVar1 * 8) =
           *(undefined4 *)((long)userData + (long)iVar2 * 4);
      *(undefined4 *)((long)outputBuffer + uVar1 * 8 + 4) =
           *(undefined4 *)((long)userData + (long)iVar3 * 4);
      iVar2 = (-(uint)(0xc6 < iVar2) & 0xffffff39 | ~-(uint)(0xc6 < iVar2) & 1) + iVar2;
      iVar3 = (-(uint)(0xc4 < iVar3) & 0xffffff3b | ~-(uint)(0xc4 < iVar3) & 3) + iVar3;
      uVar1 = uVar1 + 1;
    } while (framesPerBuffer != uVar1);
    *(int *)((long)userData + 800) = iVar2;
    *(int *)((long)userData + 0x324) = iVar3;
  }
  return 0;
}

Assistant:

static int patestCallback( const void *inputBuffer, void *outputBuffer,
                            unsigned long framesPerBuffer,
                            const PaStreamCallbackTimeInfo* timeInfo,
                            PaStreamCallbackFlags statusFlags,
                            void *userData )
{
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    unsigned long i;

    (void) timeInfo; /* Prevent unused variable warnings. */
    (void) statusFlags;
    (void) inputBuffer;
    
    for( i=0; i<framesPerBuffer; i++ )
    {
        *out++ = data->sine[data->left_phase];  /* left */
        *out++ = data->sine[data->right_phase];  /* right */
        data->left_phase += 1;
        if( data->left_phase >= TABLE_SIZE ) data->left_phase -= TABLE_SIZE;
        data->right_phase += 3; /* higher pitch so we can distinguish left and right. */
        if( data->right_phase >= TABLE_SIZE ) data->right_phase -= TABLE_SIZE;
    }
    
    return paContinue;
}